

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::get_synciv(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GLsync p_Var2;
  GLsizei length;
  GLint values [32];
  GLsizei local_bc;
  string local_b8;
  GLint local_98 [32];
  
  local_bc = -1;
  local_98[0x1c] = 0xcdcdcdcd;
  local_98[0x1d] = 0xcdcdcdcd;
  local_98[0x1e] = 0xcdcdcdcd;
  local_98[0x1f] = 0xcdcdcdcd;
  local_98[0x18] = 0xcdcdcdcd;
  local_98[0x19] = 0xcdcdcdcd;
  local_98[0x1a] = 0xcdcdcdcd;
  local_98[0x1b] = 0xcdcdcdcd;
  local_98[0x14] = 0xcdcdcdcd;
  local_98[0x15] = 0xcdcdcdcd;
  local_98[0x16] = 0xcdcdcdcd;
  local_98[0x17] = 0xcdcdcdcd;
  local_98[0x10] = 0xcdcdcdcd;
  local_98[0x11] = 0xcdcdcdcd;
  local_98[0x12] = 0xcdcdcdcd;
  local_98[0x13] = 0xcdcdcdcd;
  local_98[0xc] = 0xcdcdcdcd;
  local_98[0xd] = 0xcdcdcdcd;
  local_98[0xe] = 0xcdcdcdcd;
  local_98[0xf] = 0xcdcdcdcd;
  local_98[8] = 0xcdcdcdcd;
  local_98[9] = 0xcdcdcdcd;
  local_98[10] = 0xcdcdcdcd;
  local_98[0xb] = 0xcdcdcdcd;
  local_98[4] = 0xcdcdcdcd;
  local_98[5] = 0xcdcdcdcd;
  local_98[6] = 0xcdcdcdcd;
  local_98[7] = 0xcdcdcdcd;
  local_98[0] = -0x32323233;
  local_98[1] = 0xcdcdcdcd;
  local_98[2] = 0xcdcdcdcd;
  local_98[3] = 0xcdcdcdcd;
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "GL_INVALID_VALUE is generated if sync is not the name of a sync object.","");
  NegativeTestContext::beginSection(ctx,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetSynciv
            (&ctx->super_CallLogWrapper,(GLsync)0x0,0x9112,0x20,&local_bc,local_98);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "GL_INVALID_ENUM is generated if pname is not one of the accepted tokens.","");
  NegativeTestContext::beginSection(ctx,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = glu::CallLogWrapper::glFenceSync(&ctx->super_CallLogWrapper,0x9117,0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetSynciv
            (&ctx->super_CallLogWrapper,p_Var2,0xffffffff,0x20,&local_bc,local_98);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteSync(&ctx->super_CallLogWrapper,p_Var2);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"GL_INVALID_VALUE is generated if bufSize is negative.","");
  NegativeTestContext::beginSection(ctx,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = glu::CallLogWrapper::glFenceSync(&ctx->super_CallLogWrapper,0x9117,0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetSynciv(&ctx->super_CallLogWrapper,p_Var2,0x9112,-1,&local_bc,local_98);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteSync(&ctx->super_CallLogWrapper,p_Var2);
  return;
}

Assistant:

void get_synciv (NegativeTestContext& ctx)
{
	GLsizei	length		= -1;
	GLint	values[32];
	GLsync	sync;

	deMemset(&values[0], 0xcd, sizeof(values));

	ctx.beginSection("GL_INVALID_VALUE is generated if sync is not the name of a sync object.");
	ctx.glGetSynciv(0, GL_OBJECT_TYPE, 32, &length, &values[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not one of the accepted tokens.");
	sync = ctx.glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetSynciv(sync, -1, 32, &length, &values[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteSync(sync);

	ctx.beginSection("GL_INVALID_VALUE is generated if bufSize is negative.");
	sync = ctx.glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetSynciv(sync, GL_OBJECT_TYPE, -1, &length, &values[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteSync(sync);
}